

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O2

string * __thiscall
jsonnet::internal::(anonymous_namespace)::type_str_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Type t)

{
  int iVar1;
  ostream *poVar2;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_17;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  iVar1 = (int)this;
  switch(iVar1) {
  case 0x10:
    __s = "array";
    __a = &local_14;
    break;
  case 0x11:
    __s = "function";
    __a = &local_15;
    break;
  case 0x12:
    __s = "object";
    __a = &local_16;
    break;
  case 0x13:
    __s = "string";
    __a = &local_17;
    break;
  default:
    if (iVar1 == 2) {
      __s = "number";
      __a = &local_13;
    }
    else if (iVar1 == 1) {
      __s = "boolean";
      __a = &local_12;
    }
    else {
      if (iVar1 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unknown type: ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
        std::endl<char,std::char_traits<char>>(poVar2);
        abort();
      }
      __s = "null";
      __a = &local_11;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string type_str(Value::Type t)
{
    switch (t) {
        case Value::NULL_TYPE: return "null";
        case Value::BOOLEAN: return "boolean";
        case Value::NUMBER: return "number";
        case Value::ARRAY: return "array";
        case Value::FUNCTION: return "function";
        case Value::OBJECT: return "object";
        case Value::STRING: return "string";
        default:
            std::cerr << "INTERNAL ERROR: Unknown type: " << t << std::endl;
            std::abort();
            return "";  // Quiet, compiler.
    }
}